

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

void read_16_rgb_555_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  uint16_t uVar1;
  long lVar2;
  long lVar3;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  uint16_t pixel;
  size_t bytes_read;
  size_t bytes_wanted;
  uint32_t *data32;
  int i;
  int local_24;
  
  lVar2 = (long)(int)((in_ECX + (in_ECX & 1)) * 2);
  lVar3 = al_fread(in_RDI,in_RSI,lVar2);
  memset((void *)(in_RSI + lVar3),0,lVar2 - lVar3);
  for (local_24 = 0; local_24 < (int)in_ECX; local_24 = local_24 + 1) {
    uVar1 = read_16le((void *)(in_RSI + (local_24 << 1)));
    *(uint *)(in_RDX + (long)local_24 * 4) =
         *(int *)(&_al_rgb_scale_5 + (long)(int)(uVar1 & 0x1f) * 4) << 0x10 | 0xff000000U |
         *(int *)(&_al_rgb_scale_5 + (long)((int)(uVar1 & 0x3e0) >> 5) * 4) << 8 |
         *(uint *)(&_al_rgb_scale_5 + (long)((int)(uVar1 & 0x7c00) >> 10) * 4);
  }
  return;
}

Assistant:

static void read_16_rgb_555_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = (length + (length & 1)) * 2;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   (void)premul;

   for (i = 0; i < length; ++i) {
      uint16_t pixel = read_16le(buf + i*2);
      data32[i] = ALLEGRO_CONVERT_RGB_555_TO_ABGR_8888_LE(pixel);
   }
}